

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

void __thiscall cmCTestRunTest::CheckOutput(cmCTestRunTest *this,string *line)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmCTest *pcVar3;
  char *pcVar4;
  pointer ppVar5;
  cmCTestTestProperties *pcVar6;
  pointer pbVar7;
  pointer pbVar8;
  bool bVar9;
  ostream *poVar10;
  long lVar11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  ulong uVar13;
  RegularExpression *pRVar14;
  pointer this_00;
  string label;
  ostringstream cmCTestLog_msg;
  value_type local_1e0;
  long *local_1c0;
  long local_1b0 [2];
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  poVar10 = (ostream *)std::ostream::operator<<((ostringstream *)&local_1a0,this->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,(line->_M_dataplus)._M_p,line->_M_string_length);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  pcVar3 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2c,local_1e0._M_dataplus._M_p,false);
  paVar2 = &local_1e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                             local_1e0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  if ((line->_M_string_length != 0) &&
     (lVar11 = std::__cxx11::string::find((char *)line,0x87bc70,0), lVar11 != -1)) {
    pRVar14 = &this->TestHandler->CustomCompletionStatusRegex;
    bVar9 = cmsys::RegularExpression::find(pRVar14,(line->_M_dataplus)._M_p,&pRVar14->regmatch);
    if (bVar9) {
      pcVar4 = (this->TestHandler->CustomCompletionStatusRegex).regmatch.startp[1];
      if (pcVar4 == (char *)0x0) {
        local_1a0 = &local_190;
        local_198 = 0;
        local_190 = 0;
      }
      else {
        local_1a0 = &local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a0,pcVar4,
                   (this->TestHandler->CustomCompletionStatusRegex).regmatch.endp[1]);
      }
      std::__cxx11::string::operator=
                ((string *)&(this->TestResult).CustomCompletionStatus,(string *)&local_1a0);
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0,CONCAT71(uStack_18f,local_190) + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      poVar10 = (ostream *)std::ostream::operator<<((ostringstream *)&local_1a0,this->Index);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Test Details changed to \'",0x19);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(this->TestResult).CustomCompletionStatus._M_dataplus._M_p,
                           (this->TestResult).CustomCompletionStatus._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'",1);
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x3a,local_1e0._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1e0._M_dataplus._M_p,
                        CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                                 local_1e0.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
      std::ios_base::~ios_base(local_130);
      return;
    }
    pRVar14 = &this->TestHandler->CustomLabelRegex;
    bVar9 = cmsys::RegularExpression::find(pRVar14,(line->_M_dataplus)._M_p,&pRVar14->regmatch);
    if (bVar9) {
      pcVar4 = (this->TestHandler->CustomLabelRegex).regmatch.startp[1];
      local_1e0._M_dataplus._M_p = (pointer)paVar2;
      if (pcVar4 == (char *)0x0) {
        local_1e0._M_string_length = 0;
        local_1e0.field_2._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e0,pcVar4,
                   (this->TestHandler->CustomLabelRegex).regmatch.endp[1]);
      }
      pcVar6 = this->TestProperties;
      _Var12 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         ((pcVar6->Labels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (pcVar6->Labels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&local_1e0);
      if (_Var12._M_current ==
          (pcVar6->Labels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pcVar6->Labels,&local_1e0);
        pbVar7 = (pcVar6->Labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 = (pcVar6->Labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar7 != pbVar8) {
          uVar13 = (long)pbVar8 - (long)pbVar7 >> 5;
          lVar11 = 0x3f;
          if (uVar13 != 0) {
            for (; uVar13 >> lVar11 == 0; lVar11 = lVar11 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (pbVar7,pbVar8,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pbVar7,pbVar8);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
        poVar10 = (ostream *)std::ostream::operator<<(&local_1a0,this->Index);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Test Label added: \'",0x13);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'",1);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pcVar3 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x45,(char *)local_1c0,false);
        if (local_1c0 != local_1b0) {
          operator_delete(local_1c0,local_1b0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
        std::ios_base::~ios_base(local_130);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p == paVar2) {
        return;
      }
      operator_delete(local_1e0._M_dataplus._M_p,
                      CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                               local_1e0.field_2._M_local_buf[0]) + 1);
      return;
    }
  }
  psVar1 = &this->ProcessOutput;
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)(line->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)psVar1);
  this_00 = (this->TestProperties->TimeoutRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->TestProperties->TimeoutRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_00 == ppVar5) {
      return;
    }
    bVar9 = cmsys::RegularExpression::find
                      (&this_00->first,(psVar1->_M_dataplus)._M_p,(RegularExpressionMatch *)this_00)
    ;
    if (bVar9) break;
    this_00 = this_00 + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  poVar10 = (ostream *)std::ostream::operator<<((ostringstream *)&local_1a0,this->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Test timeout changed to ",0x18);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  pcVar3 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x5b,local_1e0._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                             local_1e0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  cmProcess::ResetStartTime
            ((this->TestProcess)._M_t.
             super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
             super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
             super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl);
  cmProcess::ChangeTimeout
            ((this->TestProcess)._M_t.
             super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
             super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
             super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl,
             (cmDuration)(this->TestProperties->AlternateTimeout).__r);
  std::
  vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase_at_end(&this->TestProperties->TimeoutRegularExpressions,
                    (this->TestProperties->TimeoutRegularExpressions).
                    super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void cmCTestRunTest::CheckOutput(std::string const& line)
{
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             this->GetIndex() << ": " << line << std::endl);

  // Check for special CTest XML tags in this line of output.
  // If any are found, this line is excluded from ProcessOutput.
  if (!line.empty() && line.find("<CTest") != std::string::npos) {
    bool ctest_tag_found = false;
    if (this->TestHandler->CustomCompletionStatusRegex.find(line)) {
      ctest_tag_found = true;
      this->TestResult.CustomCompletionStatus =
        this->TestHandler->CustomCompletionStatusRegex.match(1);
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 this->GetIndex() << ": "
                                  << "Test Details changed to '"
                                  << this->TestResult.CustomCompletionStatus
                                  << "'" << std::endl);
    } else if (this->TestHandler->CustomLabelRegex.find(line)) {
      ctest_tag_found = true;
      auto label = this->TestHandler->CustomLabelRegex.match(1);
      auto& labels = this->TestProperties->Labels;
      if (std::find(labels.begin(), labels.end(), label) == labels.end()) {
        labels.push_back(label);
        std::sort(labels.begin(), labels.end());
        cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                   this->GetIndex()
                     << ": "
                     << "Test Label added: '" << label << "'" << std::endl);
      }
    }
    if (ctest_tag_found) {
      return;
    }
  }

  this->ProcessOutput += line;
  this->ProcessOutput += "\n";

  // Check for TIMEOUT_AFTER_MATCH property.
  if (!this->TestProperties->TimeoutRegularExpressions.empty()) {
    for (auto& reg : this->TestProperties->TimeoutRegularExpressions) {
      if (reg.first.find(this->ProcessOutput)) {
        cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                   this->GetIndex()
                     << ": "
                     << "Test timeout changed to "
                     << std::chrono::duration_cast<std::chrono::seconds>(
                          this->TestProperties->AlternateTimeout)
                          .count()
                     << std::endl);
        this->TestProcess->ResetStartTime();
        this->TestProcess->ChangeTimeout(
          this->TestProperties->AlternateTimeout);
        this->TestProperties->TimeoutRegularExpressions.clear();
        break;
      }
    }
  }
}